

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O1

int __thiscall io::posix::file::open(file *this,char *__file,int __oflag,...)

{
  int iVar1;
  int *piVar2;
  undefined8 extraout_RAX;
  uint in_ECX;
  int *in_R8;
  file_descriptor_handle local_40;
  undefined8 local_38;
  
  local_38 = std::_V2::system_category();
  *in_R8 = 0;
  *(undefined8 *)(in_R8 + 2) = local_38;
  piVar2 = __errno_location();
  *piVar2 = 0;
  iVar1 = ::open(*(char **)__file,__oflag,(ulong)in_ECX);
  if (iVar1 < 0) {
    *in_R8 = *piVar2;
    *(undefined8 *)(in_R8 + 2) = local_38;
  }
  else {
    local_40.delete_ = true;
    local_40.fd_ = iVar1;
    if (&local_40 != &this->fd_) {
      local_40.fd_ = (this->fd_).fd_;
      (this->fd_).fd_ = iVar1;
      local_40.delete_ = (this->fd_).delete_;
      (this->fd_).delete_ = true;
    }
    file_descriptor_handle::~file_descriptor_handle(&local_40);
    local_38 = extraout_RAX;
  }
  return (int)local_38;
}

Assistant:

void open(const io_std::filesystem::path& path,
              int mode, ::mode_t create_perms, std::error_code& ec) noexcept
    {
        ec.clear();
        errno = 0;

        int new_fd = ::open(path.c_str(), mode, create_perms);

        if (new_fd < 0) {
            ec.assign(errno, std::system_category());
            return;
        }

        fd_ = posix::file_descriptor_handle{new_fd};
    }